

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uint uVar1;
  alpha_cluster *paVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  int i;
  int iVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  vector<unsigned_char> selectors;
  results results;
  params params;
  params refinerParams;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint alpha_values [8];
  uint encoding_weight [8];
  dxt5_endpoint_optimizer optimizer;
  elemental_vector local_5e8;
  alpha_cluster *local_5d8;
  long local_5d0;
  results local_5c8;
  params local_5b0;
  params local_590;
  ulong local_558;
  vector<unsigned_long_long> *local_550;
  ulong local_548;
  dxt_hc *local_540;
  ulong local_538;
  vector<unsigned_int> *local_530;
  vector<unsigned_long_long> *local_528;
  ulong local_520;
  results local_518;
  uint local_508 [8];
  dxt_endpoint_refiner local_4e8;
  uint auStack_4d8 [8];
  uint auStack_4b8 [10];
  dxt5_endpoint_optimizer local_490;
  
  uVar1 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_4e8);
  local_5e8.m_p = (uint8 *)0x0;
  local_5e8.m_size = 0;
  local_5e8.m_capacity = 0;
  if ((uint)data < (this->m_alpha_clusters).m_size) {
    local_550 = this->m_block_selectors;
    local_540 = this;
    do {
      uVar8 = data & 0xffffffff;
      lVar10 = uVar8 * 0x90;
      paVar2 = (this->m_alpha_clusters).m_p;
      uVar12 = (uint)data;
      if (paVar2[uVar8].pixels.m_size != 0) {
        local_5b0.m_block_index = 0;
        local_5b0.m_pPixels = paVar2[uVar8].pixels.m_p;
        uVar15 = paVar2[uVar8].pixels.m_size;
        local_5b0.m_comp_index = 0;
        local_5b0.m_quality = cCRNDXTQualityUber;
        local_5b0.m_use_both_block_types = false;
        local_5d8 = paVar2;
        local_5d0 = lVar10;
        local_5b0.m_num_pixels = uVar15;
        if (local_5e8.m_size != uVar15) {
          if (local_5e8.m_size <= uVar15) {
            if (local_5e8.m_capacity < uVar15) {
              elemental_vector::increase_capacity
                        (&local_5e8,uVar15,local_5e8.m_size + 1 == uVar15,1,(object_mover)0x0,false)
              ;
            }
            memset((uint8 *)((long)local_5e8.m_p + (local_5e8._8_8_ & 0xffffffff)),0,
                   (ulong)(uVar15 - local_5e8.m_size));
          }
          local_5e8.m_size = uVar15;
        }
        local_5c8.m_pSelectors = (uint8 *)local_5e8.m_p;
        dxt5_endpoint_optimizer::compute(&local_490,&local_5b0,&local_5c8);
        paVar2[uVar8].first_endpoint = (uint)local_5c8.m_first_endpoint;
        paVar2[uVar8].second_endpoint = (uint)local_5c8.m_second_endpoint;
        dxt5_block::get_block_values
                  (local_508,paVar2[uVar8].first_endpoint,(uint)local_5c8.m_second_endpoint);
        lVar10 = 0;
        do {
          uVar19 = local_508[(byte)(&g_dxt5_from_linear)[lVar10]];
          *(uint *)((long)local_5d8->alpha_values + lVar10 * 4 + local_5d0 + 0x48 + -0x48) = uVar19;
          auStack_4d8[lVar10] = uVar19;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        iVar9 = paVar2[uVar8].first_endpoint - paVar2[uVar8].second_endpoint;
        uVar15 = (uint)(iVar9 * iVar9) >> 3;
        if (0x7ff < uVar15) {
          uVar15 = 0x800;
        }
        if ((uint)(iVar9 * iVar9) < 8) {
          uVar15 = 1;
        }
        lVar10 = 0;
        do {
          auStack_4b8[lVar10] =
               (uint)(long)(((float)(int)lVar10 * -0.021428568 + 1.15) * (float)uVar15);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        if (this->m_has_etc_color_blocks != false) {
          uVar15 = 1;
          if ((6 < iVar9) && (uVar15 = (iVar9 + 0xcU) / 0x12, 0xe < uVar15)) {
            uVar15 = 0xf;
          }
          uVar16 = (uint)local_5c8.m_first_endpoint + (uint)local_5c8.m_second_endpoint + 1 >> 1 &
                   0xff;
          lVar10 = 0;
          do {
            uVar19 = determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar9 < 7]
                     [lVar10] * uVar15 + uVar16;
            if (0xfe < (int)uVar19) {
              uVar19 = 0xff;
            }
            if ((int)uVar19 < 1) {
              uVar19 = 0;
            }
            *(uint *)((long)local_5d8->alpha_values + lVar10 * 4 + local_5d0 + 0x48 + -0x48) =
                 uVar19;
            auStack_4d8[lVar10] = uVar19;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          paVar2[uVar8].first_endpoint = uVar16;
          paVar2[uVar8].second_endpoint = uVar15 << 4 | (uint)(iVar9 < 7) * 2 + 0xb;
        }
        if (this->m_num_alpha_blocks != 0) {
          uVar18 = 0;
          do {
            local_548 = uVar18 + 1;
            if (paVar2[uVar8].blocks[uVar18 + 1].m_size != 0) {
              local_530 = paVar2[uVar8].blocks + uVar18 + 1;
              local_538 = (ulong)(this->m_params).m_alpha_component_indices[uVar18];
              local_528 = local_550 + local_548;
              uVar18 = 0;
              do {
                uVar15 = local_530->m_p[uVar18];
                local_520 = (ulong)auStack_4b8[(this->m_block_encodings).m_p[uVar15]];
                lVar10 = 0;
                uVar14 = 0;
                do {
                  uVar16 = 0xffffffff;
                  lVar17 = 0;
                  uVar20 = 0;
                  do {
                    if (this->m_has_etc_color_blocks == false) {
                      bVar11 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar17);
                      if ((local_5c8.m_reordered & 1U) == 0) {
                        bVar11 = *(byte *)((long)&g_dxt5_to_linear + lVar17);
                      }
                    }
                    else {
                      bVar11 = (byte)lVar17;
                    }
                    uVar13 = (uint)this->m_blocks[uVar15 >> (this->m_has_subblocks & 0x1fU)][lVar10]
                                   .field_0.c[local_538] - auStack_4d8[bVar11];
                    uVar3 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar3 = uVar13;
                    }
                    if (uVar3 < uVar16) {
                      uVar20 = (ulong)bVar11;
                      uVar16 = uVar3;
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 8);
                  uVar14 = uVar20 | uVar14 << 3;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x10);
                local_528->m_p[uVar15] = uVar14 << 0x10 | local_520;
                uVar18 = uVar18 + 1;
                this = local_540;
              } while (uVar18 < local_530->m_size);
            }
            uVar18 = local_548;
          } while (local_548 < this->m_num_alpha_blocks);
        }
        local_590.m_alpha_comp_index = 0;
        local_590.m_highest_quality = true;
        local_590.m_pSelectors = (uint8 *)local_5e8.m_p;
        local_590.m_pPixels = paVar2[uVar8].pixels.m_p;
        local_590.m_num_pixels = paVar2[uVar8].pixels.m_size;
        local_590._48_2_ = (ushort)(this->m_params).m_perceptual << 8;
        local_590.m_error_to_beat = local_5c8.m_error;
        local_590.m_block_index = uVar12;
        local_558 = data;
        if (this->m_has_etc_color_blocks == false) {
          bVar7 = dxt_endpoint_refiner::refine(&local_4e8,&local_590,&local_518);
          lVar10 = local_5d0;
          paVar2[uVar8].refined_alpha = bVar7;
          if (bVar7) {
            paVar2[uVar8].first_endpoint = (uint)local_518.m_low_color;
            paVar2[uVar8].second_endpoint = (uint)local_518.m_high_color;
            dxt5_block::get_block_values
                      (local_508,(uint)local_518.m_low_color,(uint)local_518.m_high_color);
            lVar17 = 0;
            do {
              *(uint *)((long)local_5d8->refined_alpha_values + lVar17 * 4 + lVar10) =
                   local_508[(byte)(&g_dxt5_from_linear)[lVar17]];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 8);
            goto LAB_0017563f;
          }
        }
        else {
          paVar2[uVar8].refined_alpha = false;
        }
        uVar4 = *(undefined8 *)paVar2[uVar8].alpha_values;
        uVar5 = *(undefined8 *)(paVar2[uVar8].alpha_values + 2);
        uVar6 = *(undefined8 *)(paVar2[uVar8].alpha_values + 6);
        *(undefined8 *)(paVar2[uVar8].refined_alpha_values + 4) =
             *(undefined8 *)(paVar2[uVar8].alpha_values + 4);
        *(undefined8 *)(paVar2[uVar8].refined_alpha_values + 6) = uVar6;
        *(undefined8 *)paVar2[uVar8].refined_alpha_values = uVar4;
        *(undefined8 *)(paVar2[uVar8].refined_alpha_values + 2) = uVar5;
      }
LAB_0017563f:
      uVar15 = uVar12 + uVar1 + 1;
      data = (uint64)uVar15;
    } while (uVar15 < (this->m_alpha_clusters).m_size);
  }
  if ((uint8 *)local_5e8.m_p != (uint8 *)0x0) {
    crnlib_free(local_5e8.m_p);
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}